

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

int mz_inflateEnd(mz_streamp pStream)

{
  mz_streamp pStream_local;
  
  if (pStream == (mz_streamp)0x0) {
    pStream_local._4_4_ = -2;
  }
  else {
    if (pStream->state != (mz_internal_state *)0x0) {
      (*pStream->zfree)(pStream->opaque,pStream->state);
      pStream->state = (mz_internal_state *)0x0;
    }
    pStream_local._4_4_ = 0;
  }
  return pStream_local._4_4_;
}

Assistant:

int mz_inflateEnd(mz_streamp pStream)
{
    if (!pStream)
        return MZ_STREAM_ERROR;
    if (pStream->state)
    {
        pStream->zfree(pStream->opaque, pStream->state);
        pStream->state = NULL;
    }
    return MZ_OK;
}